

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fVertexArrayTest.cpp
# Opt level: O1

int __thiscall
deqp::gles2::Functional::SingleVertexArrayOutputTypeTests::init
          (SingleVertexArrayOutputTypeTests *this,EVP_PKEY_CTX *ctx)

{
  InputType type;
  OutputType outputType_;
  GLValue max_;
  int iVar1;
  int extraout_EAX;
  MultiVertexArrayTest *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  long lVar3;
  int componentCount_;
  GLValue GVar4;
  Spec spec;
  string name;
  ArraySpec arraySpec;
  undefined1 local_e8 [16];
  pointer local_d8;
  pointer pAStack_d0;
  pointer local_c8;
  long local_c0;
  long local_b8;
  string local_b0;
  InputType local_90;
  undefined4 uStack_8c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_88;
  InputType local_80;
  undefined4 uStack_7c;
  anon_union_8_10_1f5805e9_for_GLValue_1 aStack_78;
  ArraySpec local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  local_c0 = 0;
  do {
    type = (&DAT_01c0f8b0)[local_c0];
    local_b8 = 0;
    do {
      outputType_ = (&DAT_01c0f8c8)[local_b8];
      componentCount_ = 2;
      do {
        lVar3 = 0;
        do {
          GVar4 = deqp::gls::GLValue::getMinValue(type);
          aStack_78 = GVar4.field_1;
          local_80 = GVar4.type;
          GVar4 = deqp::gls::GLValue::getMaxValue(type);
          aStack_88 = GVar4.field_1;
          local_90 = GVar4.type;
          max_._4_4_ = uStack_8c;
          max_.type = local_90;
          GVar4._4_4_ = uStack_7c;
          GVar4.type = local_80;
          GVar4.field_1 = aStack_78;
          max_.field_1 = aStack_88;
          deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                    (&local_70,type,outputType_,STORAGE_USER,USAGE_DYNAMIC_DRAW,componentCount_,0,0,
                     false,GVar4,max_);
          local_d8 = (pointer)0x0;
          pAStack_d0 = (pointer)0x0;
          local_c8 = (pointer)0x0;
          local_e8._0_4_ = PRIMITIVE_TRIANGLES;
          local_e8._4_4_ = *(int *)((long)&DAT_01c0f870 + lVar3);
          local_e8._8_4_ = 0;
          std::
          vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
          ::_M_realloc_insert<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec_const&>
                    ((vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>>
                      *)&local_d8,(iterator)0x0,&local_70);
          deqp::gls::MultiVertexArrayTest::Spec::getName_abi_cxx11_(&local_b0,(Spec *)local_e8);
          this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
          deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                    (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                             m_testCtx,((this->super_TestCaseGroup).m_context)->m_renderCtx,
                     (Spec *)local_e8,local_b0._M_dataplus._M_p,local_b0._M_dataplus._M_p);
          tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
          paVar2 = &local_b0.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != paVar2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            paVar2 = extraout_RAX;
          }
          iVar1 = (int)paVar2;
          if (local_d8 != (pointer)0x0) {
            operator_delete(local_d8,(long)local_c8 - (long)local_d8);
            iVar1 = extraout_EAX;
          }
          lVar3 = lVar3 + 4;
        } while (lVar3 == 4);
        componentCount_ = componentCount_ + 1;
      } while (componentCount_ != 5);
      local_b8 = local_b8 + 1;
    } while (local_b8 != 3);
    local_c0 = local_c0 + 1;
  } while (local_c0 != 6);
  return iVar1;
}

Assistant:

void SingleVertexArrayOutputTypeTests::init (void)
{
	// Test output types with different input types, component counts and storage, Usage?, Precision?, float?
	Array::InputType	inputTypes[]	= {Array::INPUTTYPE_FLOAT, Array::INPUTTYPE_SHORT, Array::INPUTTYPE_BYTE, Array::INPUTTYPE_UNSIGNED_SHORT, Array::INPUTTYPE_UNSIGNED_BYTE, Array::INPUTTYPE_FIXED};
	Array::OutputType	outputTypes[]	= {Array::OUTPUTTYPE_VEC2, Array::OUTPUTTYPE_VEC3, Array::OUTPUTTYPE_VEC4};
	Array::Storage		storages[]		= {Array::STORAGE_USER};
	int					counts[]		= {1, 256};

	for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); inputTypeNdx++)
	{
		for (int outputTypeNdx = 0; outputTypeNdx < DE_LENGTH_OF_ARRAY(outputTypes); outputTypeNdx++)
		{
			for (int storageNdx = 0; storageNdx < DE_LENGTH_OF_ARRAY(storages); storageNdx++)
			{
				for (int componentCount = 2; componentCount < 5; componentCount++)
				{
					for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
					{
						MultiVertexArrayTest::Spec::ArraySpec arraySpec(inputTypes[inputTypeNdx],
																		outputTypes[outputTypeNdx],
																		storages[storageNdx],
																		Array::USAGE_DYNAMIC_DRAW,
																		componentCount,
																		0,
																		0,
																		false,
																		GLValue::getMinValue(inputTypes[inputTypeNdx]),
																		GLValue::getMaxValue(inputTypes[inputTypeNdx]));

						MultiVertexArrayTest::Spec spec;
						spec.primitive	= Array::PRIMITIVE_TRIANGLES;
						spec.drawCount	= counts[countNdx];
						spec.first		= 0;
						spec.arrays.push_back(arraySpec);

						std::string name = spec.getName();
						addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
					}
				}
			}
		}
	}
}